

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

int __thiscall CPU::instrADC0x6d(CPU *this)

{
  uint8_t argument;
  CPU *in_RDI;
  
  argument = absolute_addr(in_RDI);
  ADC(in_RDI,argument);
  return 4;
}

Assistant:

int CPU::instrADC0x6d() {
	ADC(absolute_addr());
	return 4;
}